

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O1

void __thiscall
hbm::streaming::Controller::subscribe(Controller *this,signalReferences_t *signalReferences)

{
  pointer pcVar1;
  Value *pVVar2;
  pointer value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Value content;
  ValueHolder local_f8 [2];
  undefined1 local_e8 [24];
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  if ((signalReferences->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (signalReferences->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    Json::Value::Value(&local_d0,nullValue);
    Json::Value::Value(&local_58,"2.0");
    pVVar2 = Json::Value::operator[](&local_d0,"jsonrpc");
    Json::Value::operator=(pVVar2,&local_58);
    Json::Value::~Value(&local_58);
    pcVar1 = (this->m_streamId)._M_dataplus._M_p;
    local_f8[0].string_ = local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f8,pcVar1,pcVar1 + (this->m_streamId)._M_string_length);
    std::__cxx11::string::append((char *)&local_f8[0].int_);
    Json::Value::Value(&local_80,(string *)local_f8);
    pVVar2 = Json::Value::operator[](&local_d0,"method");
    Json::Value::operator=(pVVar2,&local_80);
    Json::Value::~Value(&local_80);
    if (local_f8[0] != local_e8) {
      operator_delete(local_f8[0].string_);
    }
    value = (signalReferences->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
    if (value != (signalReferences->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pVVar2 = Json::Value::operator[](&local_d0,"params");
        Json::Value::Value((Value *)local_f8,value);
        Json::Value::append(pVVar2,(Value *)local_f8);
        Json::Value::~Value((Value *)local_f8);
        value = value + 1;
      } while (value != (signalReferences->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish);
    }
    s_id = s_id + 1;
    Json::Value::Value(&local_a8,s_id);
    pVVar2 = Json::Value::operator[](&local_d0,"id");
    Json::Value::operator=(pVVar2,&local_a8);
    Json::Value::~Value(&local_a8);
    execute(this,&local_d0);
    Json::Value::~Value(&local_d0);
  }
  return;
}

Assistant:

void Controller::subscribe(const signalReferences_t &signalReferences)
		{
			if(signalReferences.empty()) {
				return;
			}
			Json::Value content;
			content[JSONRPC] = "2.0";
			content[METHOD] = m_streamId +".subscribe";
			for(signalReferences_t::const_iterator iter = signalReferences.begin(); iter!=signalReferences.end(); ++iter) {
				content[PARAMS].append(*iter);
			}
			content["id"] = ++s_id;

			execute(content);
		}